

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore_test.cpp
# Opt level: O0

pint p_test_case_psemaphore_thread_test(void)

{
  int iVar1;
  pint pVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  PSemaphore *sem;
  PUThread *thr2;
  PUThread *thr1;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar3 = p_semaphore_new("p_semaphore_test_object",10,1,0);
  if (lVar3 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xb8);
    exit(-1);
  }
  p_semaphore_take_ownership(lVar3);
  p_semaphore_free(lVar3);
  is_thread_exit = 0;
  semaphore_test_val = 10;
  lVar3 = p_uthread_create(semaphore_test_thread,0,1);
  if (lVar3 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xc1);
    exit(-1);
  }
  lVar4 = p_uthread_create(semaphore_test_thread,0,1);
  if (lVar4 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xc4);
    exit(-1);
  }
  iVar1 = p_uthread_join(lVar3);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xc6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_uthread_join(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,199);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  if (semaphore_test_val != 10) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xc9);
    exit(-1);
  }
  iVar1 = p_semaphore_acquire(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xcb);
    exit(-1);
  }
  iVar1 = p_semaphore_release(0,0);
  if (iVar1 != 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xcc);
    exit(-1);
  }
  p_semaphore_free(0);
  p_semaphore_take_ownership(0);
  lVar5 = p_semaphore_new("p_semaphore_test_object",1,0);
  if (lVar5 == 0) {
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psemaphore_test.cpp"
           ,0xd1);
    exit(-1);
  }
  p_semaphore_take_ownership(lVar5);
  p_semaphore_free(lVar5);
  p_uthread_unref(lVar3);
  p_uthread_unref(lVar4);
  p_libsys_shutdown();
  pVar2 = -1;
  if (p_test_module_fail_counter == 0) {
    pVar2 = 0;
  }
  return pVar2;
}

Assistant:

P_TEST_CASE_BEGIN (psemaphore_thread_test)
{
	PUThread	*thr1;
	PUThread	*thr2;
	PSemaphore	*sem = NULL;

	p_libsys_init ();

	sem = p_semaphore_new ("p_semaphore_test_object", 10, P_SEM_ACCESS_CREATE, NULL);
	P_TEST_REQUIRE (sem != NULL);
	p_semaphore_take_ownership (sem);
	p_semaphore_free (sem);

	sem                = NULL;
	is_thread_exit     = 0;
	semaphore_test_val = PSEMAPHORE_MAX_VAL;

	thr1 = p_uthread_create ((PUThreadFunc) semaphore_test_thread, NULL, TRUE, NULL);
	P_TEST_REQUIRE (thr1 != NULL);

	thr2 = p_uthread_create ((PUThreadFunc) semaphore_test_thread, NULL, TRUE, NULL);
	P_TEST_REQUIRE (thr2 != NULL);

	P_TEST_CHECK (p_uthread_join (thr1) == 0);
	P_TEST_CHECK (p_uthread_join (thr2) == 0);

	P_TEST_REQUIRE (semaphore_test_val == PSEMAPHORE_MAX_VAL);

	P_TEST_REQUIRE (p_semaphore_acquire (sem, NULL) == FALSE);
	P_TEST_REQUIRE (p_semaphore_release (sem, NULL) == FALSE);
	p_semaphore_free (sem);
	p_semaphore_take_ownership (sem);

	sem = p_semaphore_new ("p_semaphore_test_object", 1, P_SEM_ACCESS_OPEN, NULL);
	P_TEST_REQUIRE (sem != NULL);
	p_semaphore_take_ownership (sem);
	p_semaphore_free (sem);

	p_uthread_unref (thr1);
	p_uthread_unref (thr2);

	p_libsys_shutdown ();
}